

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldCoordinates.cpp
# Opt level: O2

WorldCoordinates *
KDIS::DATA_TYPE::WorldCoordinates::Lerp
          (WorldCoordinates *__return_storage_ptr__,WorldCoordinates *From,WorldCoordinates *To,
          KFLOAT32 T)

{
  double dVar1;
  double dVar2;
  WorldCoordinates tmp;
  WorldCoordinates tmp_1;
  DataTypeBase local_58;
  undefined1 local_50 [16];
  double local_40;
  undefined1 local_38 [24];
  double local_20;
  
  local_58._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00214f40;
  dVar1 = (double)To->m_f64X - (double)From->m_f64X;
  dVar2 = (double)To->m_f64Y - (double)From->m_f64Y;
  local_50._8_4_ = SUB84(dVar2,0);
  local_50._0_8_ = dVar1;
  local_50._12_4_ = (int)((ulong)dVar2 >> 0x20);
  local_40 = (double)To->m_f64Z - (double)From->m_f64Z;
  local_38._0_8_ = &PTR__DataTypeBase_00214f40;
  local_20 = (double)(float)T;
  local_38._16_4_ = SUB84(local_20 * (double)local_50._8_8_,0);
  local_38._8_8_ = local_20 * dVar1;
  local_38._20_4_ = (int)((ulong)(local_20 * (double)local_50._8_8_) >> 0x20);
  local_20 = local_20 * local_40;
  operator+(From,(WorldCoordinates *)local_38);
  DataTypeBase::~DataTypeBase((DataTypeBase *)local_38);
  DataTypeBase::~DataTypeBase(&local_58);
  return __return_storage_ptr__;
}

Assistant:

WorldCoordinates WorldCoordinates::Lerp( const WorldCoordinates & From, const WorldCoordinates & To, KFLOAT32 T )
{
    return From + ( ( To - From ) * T );
}